

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::exception_message(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *this,token_type expected,string *context)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  token_type in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  allocator<char> *paVar2;
  string *this_00;
  allocator<char> local_1a9;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffe58;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [32];
  string local_140 [32];
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [54];
  allocator<char> local_22;
  undefined1 local_21;
  token_type local_14;
  
  local_21 = 0;
  paVar2 = &local_22;
  this_00 = in_RDI;
  local_14 = in_EDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RSI,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator(&local_22);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+((char *)paVar2,this_00);
    std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
    std::__cxx11::string::operator+=((string *)this_00,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
  }
  std::__cxx11::string::operator+=((string *)this_00,"- ");
  if (*(int *)(in_RSI + 1) == 0xe) {
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_error_message((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)&in_RSI[1]._M_string_length);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_RSI,(allocator<char> *)in_RDI);
    std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string(in_stack_fffffffffffffe58);
    std::operator+(in_RSI,in_RDI);
    std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
    std::__cxx11::string::operator+=((string *)this_00,local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
  }
  else {
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::token_type_name(*(token_type *)(in_RSI + 1));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_RSI,(allocator<char> *)in_RDI);
    std::operator+((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::__cxx11::string::operator+=((string *)this_00,local_140);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
  }
  if (local_14 != uninitialized) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::token_type_name(local_14);
    paVar2 = &local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_RSI,(allocator<char> *)in_RDI);
    std::operator+((char *)paVar2,__rhs);
    std::__cxx11::string::operator+=((string *)this_00,local_188);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe58);
    std::allocator<char>::~allocator(&local_1a9);
  }
  return in_RDI;
}

Assistant:

std::string exception_message(const token_type expected, const std::string& context)
    {
        std::string error_msg = "syntax error ";

        if (not context.empty())
        {
            error_msg += "while parsing " + context + " ";
        }

        error_msg += "- ";

        if (last_token == token_type::parse_error)
        {
            error_msg += std::string(m_lexer.get_error_message()) + "; last read: '" +
                         m_lexer.get_token_string() + "'";
        }
        else
        {
            error_msg += "unexpected " + std::string(lexer_t::token_type_name(last_token));
        }

        if (expected != token_type::uninitialized)
        {
            error_msg += "; expected " + std::string(lexer_t::token_type_name(expected));
        }

        return error_msg;
    }